

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

InterpolationViewer * FindPastViewer(AActor *actor)

{
  InterpolationViewer *pIVar1;
  InterpolationViewer *pIVar2;
  uint uVar3;
  long lVar4;
  InterpolationViewer *pIVar5;
  InterpolationViewer local_88;
  
  lVar4 = (ulong)PastViewers.Count + 1;
  pIVar5 = PastViewers.Array + -1;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      local_88.Old.Pos.X = 0.0;
      local_88.New.Angles.Yaw.Degrees = 0.0;
      local_88.New.Angles.Roll.Degrees = 0.0;
      local_88.New.Pos.Z = 0.0;
      local_88.New.Angles.Pitch.Degrees = 0.0;
      local_88.New.Pos.X = 0.0;
      local_88.New.Pos.Y = 0.0;
      local_88.Old.Angles.Roll.Degrees = 0.0;
      local_88.Old.Angles.CamRoll.Degrees = 0.0;
      local_88.Old.Angles.Pitch.Degrees = 0.0;
      local_88.Old.Angles.Yaw.Degrees = 0.0;
      local_88.Old.Pos.Y = 0.0;
      local_88.Old.Pos.Z = 0.0;
      local_88.New.Angles.CamRoll.Degrees = 0.0;
      local_88.otic = -1;
      local_88._12_4_ = 0;
      local_88.ViewActor = actor;
      TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
      uVar3 = TArray<InterpolationViewer,_InterpolationViewer>::Push(&PastViewers,&local_88);
      return PastViewers.Array + uVar3;
    }
    pIVar1 = pIVar5 + 1;
    pIVar2 = pIVar5 + 1;
    pIVar5 = pIVar1;
  } while (pIVar2->ViewActor != actor);
  return pIVar1;
}

Assistant:

static InterpolationViewer *FindPastViewer (AActor *actor)
{
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			return &PastViewers[i];
		}
	}

	// Not found, so make a new one
	InterpolationViewer iview;
	memset(&iview, 0, sizeof(iview));
	iview.ViewActor = actor;
	iview.otic = -1;
	InterpolationPath.Clear();
	return &PastViewers[PastViewers.Push (iview)];
}